

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void nni_sha1_final(nni_sha1_ctx *ctx,uint8_t *digest)

{
  uint uVar1;
  int iVar2;
  int i;
  ulong uVar3;
  long lVar4;
  uint8_t uVar5;
  
  uVar3 = (ulong)ctx->idx;
  ctx->idx = ctx->idx + 1;
  uVar5 = 0x80;
  if ((long)uVar3 < 0x38) {
    while( true ) {
      ctx->blk[(int)uVar3] = uVar5;
      uVar1 = ctx->idx;
      uVar3 = (ulong)uVar1;
      if (0x37 < (int)uVar1) break;
      ctx->idx = uVar1 + 1;
      uVar5 = '\0';
    }
  }
  else {
    while( true ) {
      ctx->blk[uVar3] = uVar5;
      uVar3 = (ulong)ctx->idx;
      if (0x3f < (long)uVar3) break;
      ctx->idx = ctx->idx + 1;
      uVar5 = '\0';
    }
    nni_sha1_process(ctx);
    while( true ) {
      iVar2 = ctx->idx;
      if (0x37 < (long)iVar2) break;
      ctx->idx = iVar2 + 1;
      ctx->blk[iVar2] = '\0';
    }
  }
  uVar3 = ctx->len;
  *(ulong *)(ctx->blk + 0x38) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  nni_sha1_process(ctx);
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    digest[lVar4 * 4] = *(uint8_t *)((long)ctx->digest + lVar4 * 4 + 3);
    digest[lVar4 * 4 + 1] = *(uint8_t *)((long)ctx->digest + lVar4 * 4 + 2);
    digest[lVar4 * 4 + 2] = *(uint8_t *)((long)ctx->digest + lVar4 * 4 + 1);
    digest[lVar4 * 4 + 3] = (uint8_t)ctx->digest[lVar4];
  }
  return;
}

Assistant:

void
nni_sha1_final(nni_sha1_ctx *ctx, uint8_t digest[20])
{
	nni_sha1_pad(ctx);
	for (int i = 0; i < 5; i++) {
		digest[i * 4]     = (ctx->digest[i] >> 24) & 0xff;
		digest[i * 4 + 1] = (ctx->digest[i] >> 16) & 0xff;
		digest[i * 4 + 2] = (ctx->digest[i] >> 8) & 0xff;
		digest[i * 4 + 3] = (ctx->digest[i] >> 0) & 0xff;
	}
}